

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::DoPackage(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  cmMakefile *pcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type sVar8;
  pointer this_00;
  char *local_2438;
  cmMakefile *local_2420;
  char *local_23f8;
  cmMakefile *local_23e0;
  char *local_2398;
  cmMakefile *local_2348;
  cmMakefile *local_22d0;
  string local_2178 [32];
  undefined1 local_2158 [8];
  ostringstream cmCPackLog_msg_16;
  allocator<char> local_1fd9;
  string local_1fd8;
  string local_1fb8;
  string local_1f98 [32];
  undefined1 local_1f78 [8];
  ostringstream cmCPackLog_msg_15;
  undefined1 local_1e00 [8];
  ofstream outF;
  string local_1bf8;
  string local_1bd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1bb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b98;
  allocator<char> local_1b72;
  allocator<char> local_1b71;
  string local_1b70;
  string local_1b50 [8];
  string hashFile;
  undefined1 local_1b10 [8];
  ostringstream cmCPackLog_msg_14;
  string local_1998 [32];
  undefined1 local_1978 [8];
  ostringstream cmCPackLog_msg_13;
  string local_1800 [32];
  undefined1 local_17e0 [8];
  ostringstream cmCPackLog_msg_12;
  char *packageFileName;
  undefined1 local_1640 [8];
  string filename;
  string local_1618;
  undefined1 local_15f8 [8];
  string tmpPF;
  string *pkgFileName;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_1598 [8];
  ostringstream cmCPackLog_msg_11;
  undefined1 local_1420 [8];
  unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> crypto;
  string local_1410;
  char *local_13f0;
  char *algo;
  undefined1 local_13c8 [8];
  ostringstream cmCPackLog_msg_10;
  string local_1250;
  allocator<char> local_1229;
  string local_1228;
  ScopePushPop local_1208;
  ScopePushPop pp;
  allocator<char> local_11f1;
  string local_11f0;
  allocator<char> local_11c9;
  string local_11c8;
  allocator<char> local_11a1;
  string local_11a0;
  string local_1180 [32];
  undefined1 local_1160 [8];
  ostringstream cmCPackLog_msg_9;
  string local_fe8 [32];
  undefined1 local_fc8 [8];
  ostringstream cmCPackLog_msg_8;
  string local_e50 [32];
  undefined1 local_e30 [8];
  ostringstream cmCPackLog_msg_7;
  string local_cb0 [32];
  undefined1 local_c90 [8];
  ostringstream cmCPackLog_msg_6;
  allocator<char> local_b11;
  undefined1 local_b10 [8];
  string findExpr;
  Glob gl;
  ostringstream local_a78 [8];
  ostringstream cmCPackLog_msg_5;
  allocator<char> local_8f9;
  string local_8f8;
  char *local_8d8;
  char *tempDirectory;
  string local_8c8;
  cmMakefile *local_8a8;
  char *tempPackageFileName;
  ostringstream local_880 [8];
  ostringstream cmCPackLog_msg_4;
  string local_708 [32];
  ostringstream local_6e8 [8];
  ostringstream cmCPackLog_msg_3;
  string local_570 [32];
  ostringstream local_550 [8];
  ostringstream cmCPackLog_msg_2;
  allocator<char> local_3d1;
  string local_3d0;
  string local_3b0 [32];
  ostringstream local_390 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_211;
  string local_210;
  char *local_1f0;
  char *toplevelDirectory;
  string local_1e0;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCPackLog_msg;
  cmCPackGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar5 = std::operator<<((ostream *)local_190,"Create package using ");
  poVar5 = std::operator<<(poVar5,(string *)&this->Name);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x3bd,pcVar6);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  iVar4 = PrepareNames(this);
  if (iVar4 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar4 = (*this->_vptr_cmCPackGenerator[6])();
    if (iVar4 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"CPACK_REMOVE_TOPLEVEL_DIRECTORY",
                 (allocator<char> *)((long)&toplevelDirectory + 7));
      pcVar6 = GetOption(this,&local_1e0);
      bVar2 = cmSystemTools::IsOn(pcVar6);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&toplevelDirectory + 7));
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,"CPACK_TOPLEVEL_DIRECTORY",&local_211);
        pcVar6 = GetOption(this,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator(&local_211);
        local_1f0 = pcVar6;
        bVar2 = cmsys::SystemTools::FileExists(pcVar6);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream(local_390);
          poVar5 = std::operator<<((ostream *)local_390,"Remove toplevel directory: ");
          poVar5 = std::operator<<(poVar5,local_1f0);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x3d1,pcVar6);
          std::__cxx11::string::~string(local_3b0);
          std::__cxx11::ostringstream::~ostringstream(local_390);
          pcVar6 = local_1f0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,pcVar6,&local_3d1)
          ;
          bVar2 = cmSystemTools::RepeatedRemoveDirectory(&local_3d0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator(&local_3d1);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_550);
            poVar5 = std::operator<<((ostream *)local_550,"Problem removing toplevel directory: ");
            poVar5 = std::operator<<(poVar5,local_1f0);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x3d5,pcVar6);
            std::__cxx11::string::~string(local_570);
            std::__cxx11::ostringstream::~ostringstream(local_550);
            return 0;
          }
        }
      }
      std::__cxx11::ostringstream::ostringstream(local_6e8);
      poVar5 = std::operator<<((ostream *)local_6e8,"About to install project ");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      pcVar1 = this->Logger;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x3db,pcVar6);
      std::__cxx11::string::~string(local_708);
      std::__cxx11::ostringstream::~ostringstream(local_6e8);
      iVar4 = InstallProject(this);
      if (iVar4 == 0) {
        this_local._4_4_ = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_880);
        poVar5 = std::operator<<((ostream *)local_880,"Done install project ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x3e0,pcVar6);
        std::__cxx11::string::~string((string *)&tempPackageFileName);
        std::__cxx11::ostringstream::~ostringstream(local_880);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8c8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                   (allocator<char> *)((long)&tempDirectory + 7));
        pcVar7 = (cmMakefile *)GetOption(this,&local_8c8);
        std::__cxx11::string::~string((string *)&local_8c8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&tempDirectory + 7));
        local_8a8 = pcVar7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_8f8,"CPACK_TEMPORARY_DIRECTORY",&local_8f9);
        pcVar6 = GetOption(this,&local_8f8);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::allocator<char>::~allocator(&local_8f9);
        local_8d8 = pcVar6;
        std::__cxx11::ostringstream::ostringstream(local_a78);
        poVar5 = std::operator<<((ostream *)local_a78,"Find files");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        pcVar1 = this->Logger;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,4,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                        ,0x3e6,pcVar6);
        std::__cxx11::string::~string((string *)&gl.ListDirs);
        std::__cxx11::ostringstream::~ostringstream(local_a78);
        cmsys::Glob::Glob((Glob *)((long)&findExpr.field_2 + 8));
        pcVar6 = local_8d8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_b10,pcVar6,&local_b11);
        std::allocator<char>::~allocator(&local_b11);
        std::__cxx11::string::operator+=((string *)local_b10,"/*");
        cmsys::Glob::RecurseOn((Glob *)((long)&findExpr.field_2 + 8));
        cmsys::Glob::SetRecurseListDirs((Glob *)((long)&findExpr.field_2 + 8),true);
        cmsys::Glob::SetRecurseThroughSymlinks((Glob *)((long)&findExpr.field_2 + 8),false);
        bVar2 = cmsys::Glob::FindFiles
                          ((Glob *)((long)&findExpr.field_2 + 8),(string *)local_b10,
                           (GlobMessages *)0x0);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e30);
          poVar5 = std::operator<<((ostream *)local_e30,"Create package");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x3f3,pcVar6);
          std::__cxx11::string::~string(local_e50);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e30);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fc8);
          poVar5 = std::operator<<((ostream *)local_fc8,"Package files to: ");
          if (local_8a8 == (cmMakefile *)0x0) {
            local_22d0 = (cmMakefile *)0x899119;
          }
          else {
            local_22d0 = local_8a8;
          }
          poVar5 = std::operator<<(poVar5,(char *)local_22d0);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x3f7,pcVar6);
          std::__cxx11::string::~string(local_fe8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fc8);
          bVar2 = cmsys::SystemTools::FileExists((char *)local_8a8);
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1160);
            poVar5 = std::operator<<((ostream *)local_1160,"Remove old package file");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x3fa,pcVar6);
            std::__cxx11::string::~string(local_1180);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1160);
            pcVar7 = local_8a8;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_11a0,(char *)pcVar7,&local_11a1);
            cmsys::SystemTools::RemoveFile(&local_11a0);
            std::__cxx11::string::~string((string *)&local_11a0);
            std::allocator<char>::~allocator(&local_11a1);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_11c8,"CPACK_INCLUDE_TOPLEVEL_DIRECTORY",&local_11c9);
          pcVar6 = GetOption(this,&local_11c8);
          bVar2 = cmSystemTools::IsOn(pcVar6);
          std::__cxx11::string::~string((string *)&local_11c8);
          std::allocator<char>::~allocator(&local_11c9);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_11f0,"CPACK_TOPLEVEL_DIRECTORY",&local_11f1);
            local_8d8 = GetOption(this,&local_11f0);
            std::__cxx11::string::~string((string *)&local_11f0);
            std::allocator<char>::~allocator(&local_11f1);
          }
          __x = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)((long)&findExpr.field_2 + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->files,__x);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear(&this->packageFileNames);
          if (local_8a8 == (cmMakefile *)0x0) {
            local_2348 = (cmMakefile *)0x8e0830;
          }
          else {
            local_2348 = local_8a8;
          }
          pp.Makefile = local_2348;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->packageFileNames,(char **)&pp);
          std::__cxx11::string::operator=((string *)&this->toplevel,local_8d8);
          cmMakefile::ScopePushPop::ScopePushPop(&local_1208,this->MakefileMap);
          pcVar7 = this->MakefileMap;
          pcVar6 = cmVersion::GetCMakeVersion();
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1228,pcVar6,&local_1229);
          std::__cxx11::string::string((string *)&local_1250);
          cmMakefile::SetPolicyVersion(pcVar7,&local_1228,&local_1250);
          std::__cxx11::string::~string((string *)&local_1250);
          std::__cxx11::string::~string((string *)&local_1228);
          std::allocator<char>::~allocator(&local_1229);
          iVar4 = (*this->_vptr_cmCPackGenerator[9])();
          if ((iVar4 == 0) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), bVar2)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_13c8);
            poVar5 = std::operator<<((ostream *)local_13c8,"Problem compressing the directory");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x416,pcVar6);
            std::__cxx11::string::~string((string *)&algo);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_13c8);
            this_local._4_4_ = 0;
            bVar2 = true;
          }
          else {
            bVar2 = false;
          }
          cmMakefile::ScopePushPop::~ScopePushPop(&local_1208);
          if (!bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1410,"CPACK_PACKAGE_CHECKSUM",
                       (allocator<char> *)
                       ((long)&crypto._M_t.
                               super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                               .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl + 7));
            pcVar6 = GetOption(this,&local_1410);
            std::__cxx11::string::~string((string *)&local_1410);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&crypto._M_t.
                               super___uniq_ptr_impl<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmCryptoHash_*,_std::default_delete<cmCryptoHash>_>
                               .super__Head_base<0UL,_cmCryptoHash_*,_false>._M_head_impl + 7));
            local_2398 = pcVar6;
            if (pcVar6 == (char *)0x0) {
              local_2398 = "";
            }
            local_13f0 = pcVar6;
            cmCryptoHash::New((cmCryptoHash *)local_1420,local_2398);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1598);
            poVar5 = std::operator<<((ostream *)local_1598,"Copying final package(s) [");
            sVar8 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&this->packageFileNames);
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar8);
            poVar5 = std::operator<<(poVar5,"]:");
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            pcVar1 = this->Logger;
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,2,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                            ,0x427,pcVar6);
            std::__cxx11::string::~string((string *)&__range1);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1598);
            __end1 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->packageFileNames);
            pkgFileName = (string *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end(&this->packageFileNames);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&pkgFileName), bVar2) {
              tmpPF.field_2._8_8_ =
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1618,"CPACK_OUTPUT_FILE_PREFIX",
                         (allocator<char> *)(filename.field_2._M_local_buf + 0xf));
              pcVar6 = GetOption(this,&local_1618);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_15f8,pcVar6,
                         (allocator<char> *)(filename.field_2._M_local_buf + 0xe));
              std::allocator<char>::~allocator
                        ((allocator<char> *)(filename.field_2._M_local_buf + 0xe));
              std::__cxx11::string::~string((string *)&local_1618);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(filename.field_2._M_local_buf + 0xf));
              cmsys::SystemTools::GetFilenameName
                        ((string *)local_1640,(string *)tmpPF.field_2._8_8_);
              local_8a8 = (cmMakefile *)std::__cxx11::string::c_str();
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &packageFileName,"/",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1640);
              std::__cxx11::string::operator+=((string *)local_15f8,(string *)&packageFileName);
              std::__cxx11::string::~string((string *)&packageFileName);
              local_2438 = (char *)std::__cxx11::string::c_str();
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_17e0);
              poVar5 = std::operator<<((ostream *)local_17e0,"Copy final package(s): ");
              if (local_8a8 == (cmMakefile *)0x0) {
                local_23e0 = (cmMakefile *)0x899119;
              }
              else {
                local_23e0 = local_8a8;
              }
              poVar5 = std::operator<<(poVar5,(char *)local_23e0);
              poVar5 = std::operator<<(poVar5," to ");
              local_23f8 = local_2438;
              if (local_2438 == (char *)0x0) {
                local_23f8 = "(NULL)";
              }
              poVar5 = std::operator<<(poVar5,local_23f8);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              pcVar1 = this->Logger;
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmCPackLog::Log(pcVar1,4,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                              ,0x433,pcVar6);
              std::__cxx11::string::~string(local_1800);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_17e0);
              bVar2 = cmsys::SystemTools::CopyFileIfDifferent
                                ((string *)tmpPF.field_2._8_8_,(string *)local_15f8);
              if (bVar2) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b10);
                poVar5 = std::operator<<((ostream *)local_1b10,"- package: ");
                poVar5 = std::operator<<(poVar5,local_2438);
                poVar5 = std::operator<<(poVar5," generated.");
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar6 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,1,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x43e,pcVar6);
                std::__cxx11::string::~string((string *)(hashFile.field_2._M_local_buf + 8));
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b10);
                bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_1420);
                if (bVar2) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1b70,"CPACK_OUTPUT_FILE_PREFIX",&local_1b71);
                  pcVar6 = GetOption(this,&local_1b70);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>(local_1b50,pcVar6,&local_1b72);
                  std::allocator<char>::~allocator(&local_1b72);
                  std::__cxx11::string::~string((string *)&local_1b70);
                  std::allocator<char>::~allocator(&local_1b71);
                  std::operator+(&local_1b98,"/",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_1640);
                  std::__cxx11::string::operator+=(local_1b50,(string *)&local_1b98);
                  std::__cxx11::string::~string((string *)&local_1b98);
                  pcVar6 = local_13f0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1bf8,pcVar6,(allocator<char> *)&outF.field_0x1ff);
                  cmsys::SystemTools::LowerCase(&local_1bd8,&local_1bf8);
                  std::operator+(&local_1bb8,".",&local_1bd8);
                  std::__cxx11::string::operator+=(local_1b50,(string *)&local_1bb8);
                  std::__cxx11::string::~string((string *)&local_1bb8);
                  std::__cxx11::string::~string((string *)&local_1bd8);
                  std::__cxx11::string::~string((string *)&local_1bf8);
                  std::allocator<char>::~allocator((allocator<char> *)&outF.field_0x1ff);
                  pcVar6 = (char *)std::__cxx11::string::c_str();
                  std::ofstream::ofstream(local_1e00,pcVar6,_S_out);
                  bVar3 = std::ios::operator!((ios *)(local_1e00 +
                                                     (long)*(_func_int **)((long)local_1e00 + -0x18)
                                                     ));
                  bVar2 = (bVar3 & 1) != 0;
                  if (bVar2) {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f78);
                    poVar5 = std::operator<<((ostream *)local_1f78,"Cannot create checksum file: ");
                    poVar5 = std::operator<<(poVar5,local_1b50);
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    pcVar1 = this->Logger;
                    std::__cxx11::ostringstream::str();
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    cmCPackLog::Log(pcVar1,0x10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                    ,0x449,pcVar6);
                    std::__cxx11::string::~string(local_1f98);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f78);
                    this_local._4_4_ = 0;
                  }
                  else {
                    this_00 = std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::
                              operator->((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>
                                          *)local_1420);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1fd8,local_2438,&local_1fd9);
                    cmCryptoHash::HashFile(&local_1fb8,this_00,&local_1fd8);
                    poVar5 = std::operator<<((ostream *)local_1e00,(string *)&local_1fb8);
                    poVar5 = std::operator<<(poVar5,"  ");
                    poVar5 = std::operator<<(poVar5,(string *)local_1640);
                    std::operator<<(poVar5,"\n");
                    std::__cxx11::string::~string((string *)&local_1fb8);
                    std::__cxx11::string::~string((string *)&local_1fd8);
                    std::allocator<char>::~allocator(&local_1fd9);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2158);
                    poVar5 = std::operator<<((ostream *)local_2158,"- checksum file: ");
                    poVar5 = std::operator<<(poVar5,local_1b50);
                    poVar5 = std::operator<<(poVar5," generated.");
                    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                    pcVar1 = this->Logger;
                    std::__cxx11::ostringstream::str();
                    pcVar6 = (char *)std::__cxx11::string::c_str();
                    cmCPackLog::Log(pcVar1,1,
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                    ,0x44f,pcVar6);
                    std::__cxx11::string::~string(local_2178);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2158);
                  }
                  std::ofstream::~ofstream(local_1e00);
                  std::__cxx11::string::~string(local_1b50);
                  if (bVar2) goto LAB_0015c435;
                }
                bVar2 = false;
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1978);
                poVar5 = std::operator<<((ostream *)local_1978,"Problem copying the package: ");
                if (local_8a8 == (cmMakefile *)0x0) {
                  local_2420 = (cmMakefile *)0x899119;
                }
                else {
                  local_2420 = local_8a8;
                }
                poVar5 = std::operator<<(poVar5,(char *)local_2420);
                poVar5 = std::operator<<(poVar5," to ");
                if (local_2438 == (char *)0x0) {
                  local_2438 = "(NULL)";
                }
                poVar5 = std::operator<<(poVar5,local_2438);
                std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
                pcVar1 = this->Logger;
                std::__cxx11::ostringstream::str();
                pcVar6 = (char *)std::__cxx11::string::c_str();
                cmCPackLog::Log(pcVar1,0x10,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                                ,0x439,pcVar6);
                std::__cxx11::string::~string(local_1998);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1978);
                this_local._4_4_ = 0;
                bVar2 = true;
              }
LAB_0015c435:
              std::__cxx11::string::~string((string *)local_1640);
              std::__cxx11::string::~string((string *)local_15f8);
              if (bVar2) goto LAB_0015c497;
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end1);
            }
            this_local._4_4_ = 1;
LAB_0015c497:
            std::unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_>::~unique_ptr
                      ((unique_ptr<cmCryptoHash,_std::default_delete<cmCryptoHash>_> *)local_1420);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c90);
          poVar5 = std::operator<<((ostream *)local_c90,
                                   "Cannot find any files in the packaging tree");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x3ef,pcVar6);
          std::__cxx11::string::~string(local_cb0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c90);
          this_local._4_4_ = 0;
        }
        std::__cxx11::string::~string((string *)local_b10);
        cmsys::Glob::~Glob((Glob *)((long)&findExpr.field_2 + 8));
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmCPackGenerator::DoPackage()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                "Create package using " << this->Name << std::endl);

  // Prepare CPack internal name and check
  // values for many CPACK_xxx vars
  if (!this->PrepareNames()) {
    return 0;
  }

  // Digest Component grouping specification
  if (!this->PrepareGroupingKind()) {
    return 0;
  }

  if (cmSystemTools::IsOn(
        this->GetOption("CPACK_REMOVE_TOPLEVEL_DIRECTORY"))) {
    const char* toplevelDirectory =
      this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    if (cmSystemTools::FileExists(toplevelDirectory)) {
      cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                    "Remove toplevel directory: " << toplevelDirectory
                                                  << std::endl);
      if (!cmSystemTools::RepeatedRemoveDirectory(toplevelDirectory)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Problem removing toplevel directory: "
                        << toplevelDirectory << std::endl);
        return 0;
      }
    }
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG,
                "About to install project " << std::endl);

  if (!this->InstallProject()) {
    return 0;
  }
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Done install project " << std::endl);

  const char* tempPackageFileName =
    this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
  const char* tempDirectory = this->GetOption("CPACK_TEMPORARY_DIRECTORY");

  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Find files" << std::endl);
  cmsys::Glob gl;
  std::string findExpr = tempDirectory;
  findExpr += "/*";
  gl.RecurseOn();
  gl.SetRecurseListDirs(true);
  gl.SetRecurseThroughSymlinks(false);
  if (!gl.FindFiles(findExpr)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot find any files in the packaging tree" << std::endl);
    return 0;
  }

  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Create package" << std::endl);
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Package files to: "
                  << (tempPackageFileName ? tempPackageFileName : "(NULL)")
                  << std::endl);
  if (cmSystemTools::FileExists(tempPackageFileName)) {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                  "Remove old package file" << std::endl);
    cmSystemTools::RemoveFile(tempPackageFileName);
  }
  if (cmSystemTools::IsOn(
        this->GetOption("CPACK_INCLUDE_TOPLEVEL_DIRECTORY"))) {
    tempDirectory = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
  }

  // The files to be installed
  files = gl.GetFiles();

  packageFileNames.clear();
  /* Put at least one file name into the list of
   * wanted packageFileNames. The specific generator
   * may update this during PackageFiles.
   * (either putting several names or updating the provided one)
   */
  packageFileNames.emplace_back(tempPackageFileName ? tempPackageFileName
                                                    : "");
  toplevel = tempDirectory;
  { // scope that enables package generators to run internal scripts with
    // latest CMake policies enabled
    cmMakefile::ScopePushPop pp{ this->MakefileMap };
    this->MakefileMap->SetPolicyVersion(cmVersion::GetCMakeVersion(),
                                        std::string());

    if (!this->PackageFiles() || cmSystemTools::GetErrorOccuredFlag()) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem compressing the directory" << std::endl);
      return 0;
    }
  }

  /* Prepare checksum algorithm*/
  const char* algo = this->GetOption("CPACK_PACKAGE_CHECKSUM");
  std::unique_ptr<cmCryptoHash> crypto = cmCryptoHash::New(algo ? algo : "");

  /*
   * Copy the generated packages to final destination
   *  - there may be several of them
   *  - the initially provided name may have changed
   *    (because the specific generator did 'normalize' it)
   */
  cmCPackLogger(cmCPackLog::LOG_VERBOSE,
                "Copying final package(s) [" << packageFileNames.size()
                                             << "]:" << std::endl);
  /* now copy package one by one */
  for (std::string const& pkgFileName : packageFileNames) {
    std::string tmpPF(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
    std::string filename(cmSystemTools::GetFilenameName(pkgFileName));
    tempPackageFileName = pkgFileName.c_str();
    tmpPF += "/" + filename;
    const char* packageFileName = tmpPF.c_str();
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Copy final package(s): "
                    << (tempPackageFileName ? tempPackageFileName : "(NULL)")
                    << " to " << (packageFileName ? packageFileName : "(NULL)")
                    << std::endl);
    if (!cmSystemTools::CopyFileIfDifferent(pkgFileName, tmpPF)) {
      cmCPackLogger(
        cmCPackLog::LOG_ERROR,
        "Problem copying the package: "
          << (tempPackageFileName ? tempPackageFileName : "(NULL)") << " to "
          << (packageFileName ? packageFileName : "(NULL)") << std::endl);
      return 0;
    }
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "- package: " << packageFileName << " generated."
                                << std::endl);

    /* Generate checksum file */
    if (crypto) {
      std::string hashFile(this->GetOption("CPACK_OUTPUT_FILE_PREFIX"));
      hashFile += "/" + filename;
      hashFile += "." + cmSystemTools::LowerCase(algo);
      cmsys::ofstream outF(hashFile.c_str());
      if (!outF) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Cannot create checksum file: " << hashFile
                                                      << std::endl);
        return 0;
      }
      outF << crypto->HashFile(packageFileName) << "  " << filename << "\n";
      cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                    "- checksum file: " << hashFile << " generated."
                                        << std::endl);
    }
  }

  return 1;
}